

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O2

void thread3(void)

{
  int iVar1;
  char str [64];
  
  put_str((char *)0x1015b2);
  for (iVar1 = 0; (the_thread->sched->shutdown_signal == false && (iVar1 != 10)); iVar1 = iVar1 + 1)
  {
    snprintf(str,0x40,"[Thread 3] running: %d");
    put_str((char *)0x1015f5);
    yield();
  }
  put_str((char *)0x10160a);
  return;
}

Assistant:

static void
thread3(void)
{
    put_str("[Thread 3] started");
    int tok = 0;
    int rounds = 10;
    while (!shutting_down() && rounds-- > 0) {
        char str[64];
        snprintf(str, sizeof str, "[Thread 3] running: %d", tok++);
        put_str(str);
        yield();
    }

    put_str("[Thread 3] exiting");
}